

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fs_write_alotof_bufs(int add_flags)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  __off64_t _Var3;
  undefined1 auVar4 [16];
  ulong uStack_38;
  int r;
  size_t index;
  char *buffer;
  uv_buf_t *iovs;
  size_t iovmax;
  size_t iovcount;
  int add_flags_local;
  
  iovmax = 0xd431;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc30,"iovs != NULL");
    abort();
  }
  iVar1 = uv_test_getiovmax();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",add_flags | 0x42,0x180);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc39,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc3a,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  for (uStack_38 = 0; uStack_38 < 0xd431; uStack_38 = uStack_38 + 1) {
    auVar4 = uv_buf_init(test_buf,0xd);
    *(undefined1 (*) [16])((long)__ptr + uStack_38 * 0x10) = auVar4;
  }
  iVar2 = uv_fs_write(0,&write_req,open_req1.result & 0xffffffff,__ptr,0xd431,0xffffffffffffffff,0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc47,"r >= 0");
    abort();
  }
  if (write_req.result != 0xac67d) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc48,"(size_t)write_req.result == sizeof(test_buf) * iovcount");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  __ptr_00 = malloc(0xac67d);
  if (__ptr_00 == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc4d,"buffer != NULL");
    abort();
  }
  for (uStack_38 = 0; uStack_38 < 0xd431; uStack_38 = uStack_38 + 1) {
    auVar4 = uv_buf_init((void *)((long)__ptr_00 + uStack_38 * 0xd),0xd);
    *(undefined1 (*) [16])((long)__ptr + uStack_38 * 0x10) = auVar4;
  }
  iVar2 = uv_fs_close(0,&close_req,open_req1.result & 0xffffffff);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc54,"r == 0");
    abort();
  }
  if (close_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc55,"close_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  iVar2 = uv_fs_open(0,&open_req1,"test_file",add_flags,0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc5a,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc5b,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  iVar2 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,__ptr,0xd431,0xffffffffffffffff,0);
  if ((ulong)(long)iVar1 < 0xd431) {
    iovmax = (long)iVar1;
  }
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc61,"r >= 0");
    abort();
  }
  if (read_req.result != iovmax * 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc62,"(size_t)read_req.result == sizeof(test_buf) * iovcount");
    abort();
  }
  for (uStack_38 = 0; uStack_38 < iovmax; uStack_38 = uStack_38 + 1) {
    iVar1 = strncmp((char *)((long)__ptr_00 + uStack_38 * 0xd),test_buf,0xd);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc67,"strncmp(buffer + index * sizeof(test_buf), test_buf, sizeof(test_buf)) == 0");
      abort();
    }
  }
  uv_fs_req_cleanup(&read_req);
  free(__ptr_00);
  _Var3 = lseek64((int)open_req1.result,write_req.result,0);
  if (_Var3 != write_req.result) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc6c,"lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result");
    abort();
  }
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&iov,1,0xffffffffffffffff,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc75,"r == 0");
    abort();
  }
  if (read_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc76,"read_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iVar1 = uv_fs_close(0,&close_req,open_req1.result & 0xffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc7a,"r == 0");
    abort();
  }
  if (close_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc7b,"close_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  unlink("test_file");
  free(__ptr);
  return;
}

Assistant:

static void fs_write_alotof_bufs(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;

  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  -1,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
    NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, iovcount, -1, NULL);
  if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT(r >= 0);
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  ASSERT(lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result);
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 -1,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}